

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O0

double __thiscall RBTS<RemSP>::Alloc(RBTS<RemSP> *this)

{
  int iVar1;
  Mat1b *pMVar2;
  int iVar3;
  PerformanceEvaluator *perf;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double qu_t;
  int buffer_capacity;
  int w;
  double ma_t;
  double t;
  Size local_80;
  Mat_<int> local_78;
  double local_18;
  double ls_t;
  RBTS<RemSP> *this_local;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar2->field_0x8;
  iVar1 = *(int *)&pMVar2->field_0xc;
  perf = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  ls_t = (double)this;
  local_18 = RemSP::Alloc(((iVar3 + 1) - (iVar3 + 1 >> 0x1f) >> 1) *
                          ((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) + 1,perf);
  PerformanceEvaluator::start(perf);
  cv::MatSize::operator()((MatSize *)&local_80);
  cv::Mat_<int>::Mat_(&local_78,&local_80);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_78)
  ;
  cv::Mat_<int>::~Mat_(&local_78);
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar4 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  PerformanceEvaluator::start
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar5 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  PerformanceEvaluator::start
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  iVar3 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc / 2 + 2;
  CircularBuffer<int>::Create(&this->s_queue_,(long)iVar3);
  CircularBuffer<int>::Create(&this->e_queue_,(long)iVar3);
  memset((this->s_queue_).buffer_,0,(long)iVar3);
  memset((this->e_queue_).buffer_,0,(long)iVar3);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar6 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  PerformanceEvaluator::start
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  memset((this->s_queue_).buffer_,0,(long)iVar3);
  memset((this->e_queue_).buffer_,0,(long)iVar3);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar7 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  return local_18 + (dVar4 - dVar5) + (dVar6 - dVar7);
}

Assistant:

double Alloc()
    {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double ma_t = t - perf_.last();

        perf_.start();
        int w(img_.cols); // w = N in the paper naming convention
        // Circular Buffers
        int buffer_capacity = w / 2 + 2;
        s_queue_.Create(buffer_capacity);
        e_queue_.Create(buffer_capacity);
        memset(s_queue_.buffer_, 0, buffer_capacity);
        memset(e_queue_.buffer_, 0, buffer_capacity);
        perf_.stop();
        double qu_t = perf_.last();
        perf_.start();
        memset(s_queue_.buffer_, 0, buffer_capacity);
        memset(e_queue_.buffer_, 0, buffer_capacity);
        perf_.stop();
        qu_t -= perf_.last();

        // Return total time
        return ls_t + ma_t + qu_t;
    }